

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O0

void __thiscall RecordType::RecordType(RecordType *this,RecordFieldList *record_fields)

{
  bool bVar1;
  long in_RSI;
  Field *in_RDI;
  TypeType in_stack_0000001c;
  iterator i;
  Type *in_stack_ffffffffffffffd0;
  __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RSI;
  Type::Type((Type *)i._M_current,in_stack_0000001c);
  (((_Vector_base<RecordField_*,_std::allocator<RecordField_*>_> *)&in_RDI->super_DataDepElement)->
  _M_impl).super__Vector_impl_data._M_start = (pointer)&PTR__RecordType_0017a5f8;
  (in_RDI->field_id_str_)._M_string_length = 0;
  if (local_10 != 0) {
    local_18._M_current =
         (RecordField **)
         std::vector<RecordField_*,_std::allocator<RecordField_*>_>::begin
                   ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)in_RDI);
    while( true ) {
      std::vector<RecordField_*,_std::allocator<RecordField_*>_>::end
                ((vector<RecordField_*,_std::allocator<RecordField_*>_> *)in_RDI);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                          *)in_stack_ffffffffffffffd0,
                         (__normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
                          *)in_RDI);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
      ::operator*(&local_18);
      Type::AddField(in_stack_ffffffffffffffd0,in_RDI);
      __gnu_cxx::
      __normal_iterator<RecordField_**,_std::vector<RecordField_*,_std::allocator<RecordField_*>_>_>
      ::operator++(&local_18);
    }
  }
  in_RDI[2].tof_ = (undefined4)local_10;
  in_RDI[2].flags_ = local_10._4_4_;
  *(undefined8 *)((long)&in_RDI[2].super_Object.location.field_2 + 8) = 0;
  return;
}

Assistant:

RecordType::RecordType(RecordFieldList* record_fields) : Type(RECORD)
	{
	// Here we assume that the type is a standalone type.
	value_var_ = nullptr;

	// Put all fields in fields_
	foreach (i, RecordFieldList, record_fields)
		AddField(*i);

	// Put RecordField's in record_fields_
	record_fields_ = record_fields;

	parsing_dataptr_var_field_ = nullptr;
	}